

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Chapters::Display::Parse(Display *this,IMkvReader *pReader,longlong pos,longlong size)

{
  char **str;
  long lVar1;
  IMkvReader *in_RCX;
  char **in_RDX;
  IMkvReader *in_RSI;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong *in_stack_ffffffffffffffb8;
  longlong *in_stack_ffffffffffffffc0;
  longlong in_stack_ffffffffffffffc8;
  
  str = (char **)((long)in_RDX + (long)in_RCX);
  do {
    do {
      if ((long)str <= (long)in_RDX) {
        if (in_RDX != str) {
          return -2;
        }
        return 0;
      }
      in_stack_ffffffffffffffb8 =
           (longlong *)
           ParseElementHeader(in_RCX,(longlong *)str,in_stack_ffffffffffffffc8,
                              in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if ((long)in_stack_ffffffffffffffb8 < 0) {
        return (long)in_stack_ffffffffffffffb8;
      }
    } while (in_stack_ffffffffffffffc0 == (longlong *)0x0);
    if (in_stack_ffffffffffffffc8 == 0x85) {
      lVar1 = UnserializeString(in_RSI,(longlong)in_RDX,(longlong)in_RCX,str);
      if (lVar1 != 0) {
        return lVar1;
      }
      in_stack_ffffffffffffffb8 = (longlong *)0x0;
    }
    else if (in_stack_ffffffffffffffc8 == 0x437c) {
      lVar1 = UnserializeString(in_RSI,(longlong)in_RDX,(longlong)in_RCX,str);
      if (lVar1 != 0) {
        return lVar1;
      }
      in_stack_ffffffffffffffb8 = (longlong *)0x0;
    }
    else if (in_stack_ffffffffffffffc8 == 0x437e) {
      lVar1 = UnserializeString(in_RSI,(longlong)in_RDX,(longlong)in_RCX,str);
      if (lVar1 != 0) {
        return lVar1;
      }
      in_stack_ffffffffffffffb8 = (longlong *)0x0;
    }
    in_RDX = (char **)((long)in_stack_ffffffffffffffc0 + (long)in_RDX);
  } while ((long)in_RDX <= (long)str);
  return -2;
}

Assistant:

long Chapters::Display::Parse(IMkvReader* pReader, long long pos,
                              long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // No payload.
      continue;

    if (id == libwebm::kMkvChapString) {
      status = UnserializeString(pReader, pos, size, m_string);

      if (status)
        return status;
    } else if (id == libwebm::kMkvChapLanguage) {
      status = UnserializeString(pReader, pos, size, m_language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvChapCountry) {
      status = UnserializeString(pReader, pos, size, m_country);

      if (status)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}